

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_fusearef(ASMState *as,IRIns *ir,RegSet allow)

{
  IRRef ref;
  Reg RVar1;
  IRIns *irx;
  RegSet allow_local;
  IRIns *ir_local;
  ASMState *as_local;
  
  ref = asm_fuseabase(as,(uint)(ir->field_0).op1);
  RVar1 = ra_alloc1(as,ref,allow);
  (as->mrm).base = (uint8_t)RVar1;
  if ((ir->field_0).op2 < 0x8000) {
    (as->mrm).ofs = as->ir[(ir->field_0).op2].field_1.op12 * 8 + (as->mrm).ofs;
    (as->mrm).idx = 0x80;
  }
  else {
    (as->mrm).scale = 0xc0;
    RVar1 = ra_alloc1(as,(uint)(ir->field_0).op2,
                      (1 << ((as->mrm).base & 0x1f) ^ 0xffffffffU) & allow);
    (as->mrm).idx = (uint8_t)RVar1;
  }
  return;
}

Assistant:

static void asm_fusearef(ASMState *as, IRIns *ir, RegSet allow)
{
  IRIns *irx;
  lj_assertA(ir->o == IR_AREF, "expected AREF");
  as->mrm.base = (uint8_t)ra_alloc1(as, asm_fuseabase(as, ir->op1), allow);
  irx = IR(ir->op2);
  if (irref_isk(ir->op2)) {
    as->mrm.ofs += 8*irx->i;
    as->mrm.idx = RID_NONE;
  } else {
    rset_clear(allow, as->mrm.base);
    as->mrm.scale = XM_SCALE8;
    /* Fuse a constant ADD (e.g. t[i+1]) into the offset.
    ** Doesn't help much without ABCelim, but reduces register pressure.
    */
    if (!LJ_64 &&  /* Has bad effects with negative index on x64. */
	mayfuse(as, ir->op2) && ra_noreg(irx->r) &&
	irx->o == IR_ADD && irref_isk(irx->op2)) {
      as->mrm.ofs += 8*IR(irx->op2)->i;
      as->mrm.idx = (uint8_t)ra_alloc1(as, irx->op1, allow);
    } else {
      as->mrm.idx = (uint8_t)ra_alloc1(as, ir->op2, allow);
    }
  }
}